

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O0

void Aig_ManUpdateLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pObj;
  int local_54;
  int local_3c;
  int local_38;
  int m;
  int k;
  int Lev;
  int LevelOld;
  int iFanout;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObjNew_local;
  Aig_Man_t *p_local;
  
  Lev = -1;
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,199,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjIsNode(pObjNew);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,200,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vLevels == (Vec_Vec_t *)0x0) {
    iVar2 = Aig_ManLevels(p);
    pVVar4 = Vec_VecAlloc(iVar2 + 8);
    p->vLevels = pVVar4;
  }
  m = Aig_ObjLevel(pObjNew);
  iVar2 = Aig_ObjLevelNew(pObjNew);
  if (m != iVar2) {
    Vec_VecClear(p->vLevels);
    Vec_VecPush(p->vLevels,m,pObjNew);
    *(ulong *)&pObjNew->field_0x18 = *(ulong *)&pObjNew->field_0x18 & 0xffffffffffffffef | 0x10;
    for (; iVar2 = Vec_VecSize(p->vLevels), m < iVar2; m = m + 1) {
      local_38 = 0;
      while( true ) {
        pVVar5 = Vec_VecEntry(p->vLevels,m);
        iVar2 = Vec_PtrSize(pVVar5);
        if (iVar2 <= local_38) break;
        pVVar5 = Vec_VecEntry(p->vLevels,m);
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_38);
        *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef;
        iVar2 = Aig_ObjLevel(pObj);
        if (iVar2 != m) {
          __assert_fail("Aig_ObjLevel(pTemp) == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                        ,0xda,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar3 = Aig_ObjLevelNew(pObj);
        *(ulong *)&pObj->field_0x18 =
             *(ulong *)&pObj->field_0x18 & 0xff000000ffffffff | ((ulong)uVar3 & 0xffffff) << 0x20;
        iVar2 = Aig_ObjLevel(pObj);
        if (iVar2 != m) {
          if (p->pFanData == (int *)0x0) {
            __assert_fail("p->pFanData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                          ,0xe0,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          local_3c = 0;
          while( true ) {
            bVar1 = false;
            if (local_3c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
              if (local_3c == 0) {
                local_54 = Aig_ObjFanout0Int(p,pObj->Id);
              }
              else {
                local_54 = Aig_ObjFanoutNext(p,Lev);
              }
              Lev = local_54;
              pTemp = Aig_ManObj(p,local_54 >> 1);
              bVar1 = true;
            }
            if (!bVar1) break;
            iVar2 = Aig_ObjIsNode(pTemp);
            if ((iVar2 != 0) && ((*(ulong *)&pTemp->field_0x18 >> 4 & 1) == 0)) {
              iVar2 = Aig_ObjLevel(pTemp);
              if (iVar2 < m) {
                __assert_fail("Aig_ObjLevel(pFanout) >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                              ,0xe4,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              pVVar4 = p->vLevels;
              iVar2 = Aig_ObjLevel(pTemp);
              Vec_VecPush(pVVar4,iVar2,pTemp);
              *(ulong *)&pTemp->field_0x18 =
                   *(ulong *)&pTemp->field_0x18 & 0xffffffffffffffef | 0x10;
            }
            local_3c = local_3c + 1;
          }
        }
        local_38 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

void Aig_ManUpdateLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanout, * pTemp;
    int iFanout = -1, LevelOld, Lev, k, m;
    assert( p->pFanData != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjLevel(pObjNew);
    if ( LevelOld == Aig_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        assert( Aig_ObjLevel(pTemp) == Lev );
        pTemp->Level = Aig_ObjLevelNew(pTemp);
        // if the level did not change, no need to check the fanout levels
        if ( Aig_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Aig_ObjForEachFanout( p, pTemp, pFanout, iFanout, m )
        {
            if ( Aig_ObjIsNode(pFanout) && !pFanout->fMarkA )
            {
                assert( Aig_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( p->vLevels, Aig_ObjLevel(pFanout), pFanout );
                pFanout->fMarkA = 1;
            }
        }
    }
}